

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O1

void * dec_vproc_thread(void *data)

{
  MppMutexCond *__mutex;
  MppThreadStatus MVar1;
  MppThread *this;
  code *pcVar2;
  Mpp *mpp;
  bool bVar3;
  MppBuffer *ppvVar4;
  pthread_mutex_t *__mutex_00;
  undefined1 uVar5;
  undefined4 uVar6;
  MppThreadStatus MVar7;
  MPP_RET MVar8;
  RK_U32 RVar9;
  MppBuffer pvVar10;
  size_t size;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  MppFrame frm;
  HalTaskHnd task;
  MppFrame local_120;
  RK_S32 tmp;
  Mpp *local_110;
  size_t local_108;
  RK_U32 local_fc;
  MppBufSlots local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  MppBuffer *local_e0;
  MppBuffer *local_d8;
  sem_t *local_d0;
  pthread_mutex_t *local_c8;
  pthread_cond_t *local_c0;
  HalTaskGroup local_b8;
  HalTaskInfo task_info;
  
  local_110 = *data;
  local_b8 = *(HalTaskGroup *)((long)data + 8);
  this = *(MppThread **)((long)data + 0x18);
  local_f8 = *(MppBufSlots *)((long)local_110->mDec + 0x30);
  task = (HalTaskHnd)0x0;
  if (((byte)mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","mpp_dec_post_proc_thread started\n",(char *)0x0);
  }
  __mutex = this->mMutexCond;
  local_c0 = (pthread_cond_t *)&this->mMutexCond[0].mCondition;
  local_c8 = (pthread_mutex_t *)(this->mMutexCond + 3);
  local_d0 = (sem_t *)((long)data + 0x28);
  local_d8 = (MppBuffer *)((long)data + 0xb8);
  local_e0 = (MppBuffer *)((long)data + 0xc0);
  do {
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    MVar7 = MppThread::get_status(this,THREAD_WORK);
    iVar13 = 5;
    if (MVar7 == MPP_THREAD_RUNNING) {
      iVar12 = 0;
      iVar13 = 0;
      if ((*(int *)((long)data + 0x90) != 0) && (iVar13 = iVar12, *(int *)((long)data + 0x20) == 0))
      {
        if ((vproc_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_dec_vproc","vproc thread wait %d","dec_vproc_thread");
        }
        MVar1 = this->mStatus[0];
        this->mStatus[0] = MPP_THREAD_WAITING;
        pthread_cond_wait(local_c0,(pthread_mutex_t *)__mutex);
        if (this->mStatus[0] == MPP_THREAD_WAITING) {
          this->mStatus[0] = MVar1;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (MVar7 == MPP_THREAD_RUNNING) {
      if ((*(byte *)((long)data + 0x8c) & 1) == 0) {
        MVar8 = hal_task_get_hnd(local_b8,1,&task);
        if (MVar8 != MPP_OK) {
          if (*(int *)((long)data + 0x20) == 0) {
            *(byte *)((long)data + 0x90) = *(byte *)((long)data + 0x90) | 1;
            iVar13 = 4;
          }
          else {
            if ((vproc_debug & 4) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","reset start\n","dec_vproc_thread");
            }
            dec_vproc_clr_prev((MppDecVprocCtxImpl *)data);
            __mutex_00 = local_c8;
            pthread_mutex_lock(local_c8);
            *(undefined4 *)((long)data + 0x20) = 0;
            pthread_mutex_unlock(__mutex_00);
            sem_post(local_d0);
            *(undefined4 *)((long)data + 0x90) = 0;
            iVar13 = 4;
            if ((vproc_debug & 4) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","reset done\n","dec_vproc_thread");
            }
          }
          goto LAB_0017a5d8;
        }
        *(byte *)((long)data + 0x8c) = *(byte *)((long)data + 0x8c) | 1;
        *(byte *)((long)data + 0x90) = *(byte *)((long)data + 0x90) & 0xfe;
      }
      if (task != (HalTaskHnd)0x0) {
        MVar8 = hal_task_hnd_get_info(task,&task_info);
        if (MVar8 != MPP_OK) {
          _mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                     "dec_vproc_thread",0x377);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0017a61e;
        }
        uVar6 = task_info.dec_vproc.input;
        uVar5 = task_info.dec.valid._0_1_;
        uVar14 = (ulong)(uint)task_info.dec_vproc.input;
        frm = (MppFrame)0x0;
        if ((task_info.dec_vproc.input < 0 & task_info.dec.valid._0_1_) == 1) {
          if ((vproc_debug & 2) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","eos signal\n","dec_vproc_thread");
          }
          mpp_frame_init(&frm);
          mpp_frame_set_eos(frm,1);
          if ((vproc_debug & 0x80) != 0) {
            mpp_frame_get_poc(frm);
            _mpp_log_l(4,"mpp_dec_vproc","output at eos, frame poc %d\n","dec_vproc_thread");
          }
          dec_vproc_put_frame(local_110,frm,(MppBuffer)0x0,-1,0);
          dec_vproc_clr_prev((MppDecVprocCtxImpl *)data);
          mpp_frame_deinit(&frm);
LAB_0017a35c:
          hal_task_hnd_set_status(task,0);
          *(byte *)((long)data + 0x8c) = *(byte *)((long)data + 0x8c) & 0xfe;
          iVar13 = 4;
        }
        else {
          mpp_buf_slot_get_prop(local_f8,task_info.dec_vproc.input,SLOT_FRAME_PTR,&frm);
          if ((uVar5 & 2) != 0) {
            if ((vproc_debug & 2) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","info change\n","dec_vproc_thread");
            }
            if ((vproc_debug & 0x80) != 0) {
              mpp_frame_get_poc(frm);
              _mpp_log_l(4,"mpp_dec_vproc","output at info change, frame poc %d\n",
                         "dec_vproc_thread");
            }
            dec_vproc_put_frame(local_110,frm,(MppBuffer)0x0,-1,0);
            dec_vproc_clr_prev((MppDecVprocCtxImpl *)data);
            pcVar2 = *(code **)(**(long **)((long)data + 0x50) + 0x18);
            if (pcVar2 != (code *)0x0) {
              (*pcVar2)(*(undefined8 *)((long)data + 0x48));
            }
            goto LAB_0017a35c;
          }
          if ((vproc_debug & 2) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","vproc get buf in","dec_vproc_thread");
          }
          if (((*(byte *)((long)data + 0x8c) & 2) == 0) && (*(int *)((long)data + 0x20) == 0)) {
            pvVar10 = mpp_frame_get_buffer(frm);
            size = mpp_buffer_get_size_with_caller(pvVar10,"dec_vproc_thread");
            ppvVar4 = local_d8;
            if (*local_d8 == (MppBuffer)0x0) {
              local_108 = size;
              mpp_buffer_get_with_tag
                        (local_110->mFrameGroup,local_d8,size,"mpp_dec_vproc","dec_vproc_thread");
              if ((vproc_debug & 0x80) != 0) {
                mpp_buffer_get_ptr_with_caller(*ppvVar4,"dec_vproc_thread");
                _mpp_log_l(4,"mpp_dec_vproc","get out buf0 ptr %p\n","dec_vproc_thread");
              }
              size = local_108;
              if (*ppvVar4 != (MppBuffer)0x0) goto LAB_0017a22b;
LAB_0017a37a:
              *(byte *)((long)data + 0x90) = *(byte *)((long)data + 0x90) | 2;
              iVar13 = 4;
              bVar3 = false;
            }
            else {
LAB_0017a22b:
              ppvVar4 = local_e0;
              if (*local_e0 == (MppBuffer)0x0) {
                mpp_buffer_get_with_tag
                          (local_110->mFrameGroup,local_e0,size,"mpp_dec_vproc","dec_vproc_thread");
                if ((vproc_debug & 0x80) != 0) {
                  mpp_buffer_get_ptr_with_caller(*ppvVar4,"dec_vproc_thread");
                  _mpp_log_l(4,"mpp_dec_vproc","get out buf1 ptr %p\n","dec_vproc_thread");
                }
                if (*ppvVar4 == (MppBuffer)0x0) goto LAB_0017a37a;
              }
              *(byte *)((long)data + 0x8c) = *(byte *)((long)data + 0x8c) | 2;
              iVar13 = 0;
              bVar3 = true;
            }
            if (bVar3) goto LAB_0017a391;
          }
          else {
LAB_0017a391:
            tmp = -1;
            mpp_buf_slot_dequeue(local_f8,&tmp,QUEUE_DEINTERLACE);
            if (tmp != uVar6) {
              _mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "tmp == index","dec_vproc_thread",0x3b5);
              if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0017a61e:
                abort();
              }
            }
            if ((vproc_debug & 2) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","vproc get buf ready & start process ","dec_vproc_thread"
                        );
            }
            if ((*(int *)((long)data + 0x20) == 0) && (*(long *)((long)data + 0x48) != 0)) {
              if ((vproc_debug & 0x40) != 0) {
                RVar9 = mpp_frame_get_poc(frm);
                local_108 = CONCAT44(local_108._4_4_,RVar9);
                local_fc = mpp_frame_get_mode(frm);
                RVar9 = mpp_frame_get_errinfo(frm);
                local_e8 = CONCAT44(extraout_var,RVar9);
                RVar9 = mpp_frame_get_discard(frm);
                local_f0 = CONCAT44(extraout_var_00,RVar9);
                pvVar10 = mpp_frame_get_buffer(frm);
                pvVar11 = mpp_buffer_get_ptr_with_caller(pvVar10,"dec_vproc_thread");
                _mpp_log_l(4,"mpp_dec_vproc",
                           "processing frame poc %d, mode 0x%x, err %x vs %x, buf slot %x, ptr %p\n"
                           ,"dec_vproc_thread",local_108 & 0xffffffff,(ulong)local_fc,local_e8,
                           local_f0,uVar14,pvVar11);
              }
              (**(code **)((long)data + 0xd0))(data,frm);
            }
            local_120 = frm;
            mpp = *data;
            (**(code **)((long)data + 0xe0))(data,frm,uVar6);
            if ((uVar5 & 1) != 0) {
              mpp_frame_init(&local_120);
              mpp_frame_set_eos(local_120,1);
              if ((vproc_debug & 0x80) != 0) {
                mpp_frame_get_poc(local_120);
                _mpp_log_l(4,"mpp_dec_vproc","output at update ref, frame poc %d\n",
                           "dec_vproc_update_ref");
              }
              dec_vproc_put_frame(mpp,local_120,(MppBuffer)0x0,-1,0);
              dec_vproc_clr_prev((MppDecVprocCtxImpl *)data);
              mpp_frame_deinit(&local_120);
            }
            hal_task_hnd_set_status(task,0);
            *(undefined8 *)((long)data + 0x8c) = 0;
            if ((vproc_debug & 2) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","vproc task done","dec_vproc_thread");
            }
            iVar13 = 0;
          }
        }
        if (iVar13 != 0) goto LAB_0017a5d8;
      }
      iVar13 = 0;
    }
LAB_0017a5d8:
    if (iVar13 == 5) {
      if (((byte)mpp_debug & 4) != 0) {
        _mpp_log_l(4,"mpp_dec_vproc","mpp_dec_post_proc_thread exited\n",(char *)0x0);
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

static void *dec_vproc_thread(void *data)
{
    MppDecVprocCtxImpl *ctx = (MppDecVprocCtxImpl *)data;
    HalTaskGroup tasks = ctx->task_group;
    MppThread *thd = ctx->thd;
    Mpp *mpp = ctx->mpp;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots slots = dec->frame_slots;

    HalTaskHnd task = NULL;
    HalTaskInfo task_info;
    HalDecVprocTask *task_vproc = &task_info.dec_vproc;

    mpp_dbg_info("mpp_dec_post_proc_thread started\n");

    while (1) {
        MPP_RET ret = MPP_OK;

        {
            AutoMutex autolock(thd->mutex());

            if (MPP_THREAD_RUNNING != thd->get_status())
                break;

            if (ctx->task_wait.val && !ctx->reset) {
                vproc_dbg_status("vproc thread wait %d", ctx->task_wait.val);
                thd->wait();
            }
        }

        if (!ctx->task_status.task_rdy) {
            if (hal_task_get_hnd(tasks, TASK_PROCESSING, &task)) {
                if (ctx->reset) {
                    /* reset only on all task finished */
                    vproc_dbg_reset("reset start\n");

                    dec_vproc_clr_prev(ctx);

                    thd->lock(THREAD_CONTROL);
                    ctx->reset = 0;
                    thd->unlock(THREAD_CONTROL);
                    sem_post(&ctx->reset_sem);
                    ctx->task_wait.val = 0;

                    vproc_dbg_reset("reset done\n");
                    continue;
                }

                ctx->task_wait.task_in = 1;
                continue;
            }
            ctx->task_status.task_rdy = 1;
            ctx->task_wait.task_in = 0;
        }

        if (task) {
            ret = hal_task_hnd_get_info(task, &task_info);

            mpp_assert(ret == MPP_OK);

            RK_S32 index = task_vproc->input;
            RK_U32 eos = task_vproc->flags.eos;
            RK_U32 change = task_vproc->flags.info_change;
            MppFrame frm = NULL;

            if (eos && index < 0) {
                vproc_dbg_status("eos signal\n");

                mpp_frame_init(&frm);
                mpp_frame_set_eos(frm, eos);
                vproc_dbg_out("output at eos, frame poc %d\n", mpp_frame_get_poc(frm));
                dec_vproc_put_frame(mpp, frm, NULL, -1, 0);
                dec_vproc_clr_prev(ctx);
                mpp_frame_deinit(&frm);

                hal_task_hnd_set_status(task, TASK_IDLE);
                ctx->task_status.task_rdy = 0;
                continue;
            }

            mpp_buf_slot_get_prop(slots, index, SLOT_FRAME_PTR, &frm);

            if (change) {
                vproc_dbg_status("info change\n");
                vproc_dbg_out("output at info change, frame poc %d\n", mpp_frame_get_poc(frm));
                dec_vproc_put_frame(mpp, frm, NULL, -1, 0);
                dec_vproc_clr_prev(ctx);

                if (ctx->com_ctx->ops->reset)
                    ctx->com_ctx->ops->reset(ctx->iep_ctx);

                hal_task_hnd_set_status(task, TASK_IDLE);
                ctx->task_status.task_rdy = 0;
                continue;
            }
            vproc_dbg_status("vproc get buf in");
            if (!ctx->task_status.buf_rdy && !ctx->reset) {
                MppBuffer buf = mpp_frame_get_buffer(frm);
                size_t buf_size = mpp_buffer_get_size(buf);
                if (!ctx->out_buf0) {
                    mpp_buffer_get(mpp->mFrameGroup, &ctx->out_buf0, buf_size);
                    vproc_dbg_out("get out buf0 ptr %p\n", mpp_buffer_get_ptr(ctx->out_buf0));
                    if (NULL == ctx->out_buf0) {
                        ctx->task_wait.task_buf_in = 1;
                        continue;
                    }
                }
                if (!ctx->out_buf1) {
                    mpp_buffer_get(mpp->mFrameGroup, &ctx->out_buf1, buf_size);
                    vproc_dbg_out("get out buf1 ptr %p\n", mpp_buffer_get_ptr(ctx->out_buf1));
                    if (NULL == ctx->out_buf1) {
                        ctx->task_wait.task_buf_in = 1;
                        continue;
                    }
                }
                ctx->task_status.buf_rdy = 1;
            }

            RK_S32 tmp = -1;
            mpp_buf_slot_dequeue(slots, &tmp, QUEUE_DEINTERLACE);
            mpp_assert(tmp == index);

            vproc_dbg_status("vproc get buf ready & start process ");
            if (!ctx->reset && ctx->iep_ctx) {
                vproc_dbg_in("processing frame poc %d, mode 0x%x, err %x vs %x, buf slot %x, ptr %p\n",
                             mpp_frame_get_poc(frm), mpp_frame_get_mode(frm), mpp_frame_get_errinfo(frm),
                             mpp_frame_get_discard(frm), index, mpp_buffer_get_ptr(mpp_frame_get_buffer(frm)));
                ctx->set_dei((MppDecVprocCtx *)ctx, frm);
            }

            dec_vproc_update_ref(ctx, frm, index, eos);
            hal_task_hnd_set_status(task, TASK_IDLE);
            ctx->task_status.val = 0;
            ctx->task_wait.val = 0;

            vproc_dbg_status("vproc task done");
        }
    }
    mpp_dbg_info("mpp_dec_post_proc_thread exited\n");

    return NULL;
}